

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgToken.cpp
# Opt level: O1

bool __thiscall rsg::Token::operator!=(Token *this,Token *other)

{
  Type TVar1;
  deBool dVar2;
  
  if (this->m_type != other->m_type) {
    return false;
  }
  if ((this->m_type == IDENTIFIER) &&
     (dVar2 = deStringEqual((this->m_arg).identifier,(other->m_arg).identifier), dVar2 == 0)) {
    return false;
  }
  TVar1 = this->m_type;
  if (TVar1 == BOOL_LITERAL) {
    if ((this->m_arg).boolValue != (other->m_arg).boolValue) {
      return false;
    }
  }
  else if (TVar1 == INT_LITERAL) {
    if ((this->m_arg).intValue != (other->m_arg).intValue) {
      return false;
    }
  }
  else if (TVar1 == FLOAT_LITERAL) {
    if ((this->m_arg).floatValue != (other->m_arg).floatValue) {
      return false;
    }
    if (NAN((this->m_arg).floatValue) || NAN((other->m_arg).floatValue)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool Token::operator!= (const Token& other) const
{
	if (m_type != other.m_type)
		return false;

	if (m_type == IDENTIFIER && !deStringEqual(m_arg.identifier, other.m_arg.identifier))
		return false;
	else if (m_type == FLOAT_LITERAL && m_arg.floatValue != other.m_arg.floatValue)
		return false;
	else if (m_type == INT_LITERAL && m_arg.intValue != other.m_arg.intValue)
		return false;
	else if (m_type == BOOL_LITERAL && m_arg.boolValue != other.m_arg.boolValue)
		return false;

	return true;
}